

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::Lower(Lowerer *this)

{
  Instr *pIVar1;
  Opnd *this_00;
  Instr *pIVar2;
  Instr *pIVar3;
  Type pBVar4;
  code *pcVar5;
  bool bVar6;
  undefined1 defaultDoFastPath;
  undefined1 defaultDoLoopFastPath;
  OpndKind OVar7;
  int32 iVar8;
  RegSlot RVar9;
  RegSlot RVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  SymOpnd *pSVar13;
  IntConstOpnd *pIVar14;
  Instr *pIVar15;
  JITTimeFunctionBody *pJVar16;
  Instr *pIVar17;
  Func *pFVar18;
  BVSparseNode *pBVar19;
  BVSparseNode *pBVar20;
  int slotId;
  undefined1 local_110 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  BVSparse<Memory::JitArenaAllocator> local_68;
  LowererMD *local_48;
  undefined4 *local_40;
  undefined1 local_31;
  
  pFVar18 = this->m_func;
  pFVar18->topFunc->maintainByteCodeOffset = false;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_110,
             L"BE-Lower",
             (pFVar18->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->m_alloc = (JitArenaAllocator *)local_110;
  localAlloc.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)0x0;
  this->initializedTempSym =
       (BVSparse<Memory::JitArenaAllocator> *)&localAlloc.super_JitArenaAllocator.bvFreeList;
  local_68.lastUsedNodePrevNextField = &local_68.head;
  local_68.head = (BVSparseNode *)0x0;
  local_68.lastFoundIndex = (Type_conflict)0x0;
  this->addToLiveOnBackEdgeSyms =
       (BVSparse<Memory::JitArenaAllocator> *)local_68.lastUsedNodePrevNextField;
  local_68.alloc = (JitArenaAllocator *)local_110;
  if (this->m_func->topFunc->m_cloneMap != (InstrMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2a,"(this->m_func->GetCloneMap() == nullptr)",
                       "this->m_func->GetCloneMap() == nullptr");
    if (!bVar6) goto LAB_0058ef43;
    *puVar11 = 0;
  }
  local_48 = &this->m_lowererMD;
  LowererMD::Init(local_48,this);
  defaultDoFastPath = Func::DoFastPaths(this->m_func);
  defaultDoLoopFastPath = Func::DoLoopFastPaths(this->m_func);
  pFVar18 = this->m_func;
  if (pFVar18->hasAnyStackNestedFunc == true) {
    EnsureStackFunctionListStackSym(this);
    pFVar18 = this->m_func;
  }
  if ((pFVar18->stackClosure == true) &&
     (bVar6 = JITTimeWorkItem::IsLoopBody(pFVar18->m_workItem), !bVar6)) {
    AllocStackClosure(this);
  }
  AllocStackForInObjectEnumeratorArray(this);
  bVar6 = Func::IsJitInDebugMode(this->m_func);
  pFVar18 = this->m_func;
  if (bVar6) {
    iVar8 = Func::GetHasLocalVarChangedOffset(pFVar18);
    local_40 = (undefined4 *)CONCAT71(local_40._1_7_,defaultDoFastPath);
    local_31 = defaultDoLoopFastPath;
    if (iVar8 != -1) {
      pSVar12 = StackSym::New(TyInt8,this->m_func);
      pSVar12->m_offset = iVar8;
      pSVar12->field_0x19 = pSVar12->field_0x19 | 0x10;
      pSVar13 = IR::SymOpnd::New(&pSVar12->super_Sym,TyInt8,this->m_func);
      pIVar14 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      pIVar15 = Func::GetFunctionEntryInsertionPoint(this->m_func);
      InsertMove(&pSVar13->super_Opnd,&pIVar14->super_Opnd,pIVar15,true);
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar9 = JITTimeFunctionBody::GetEndNonTempLocalIndex(pJVar16);
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar10 = JITTimeFunctionBody::GetFirstNonTempLocalIndex(pJVar16);
      if (RVar9 != RVar10) {
        slotId = 0;
        do {
          iVar8 = Func::GetLocalVarSlotOffset(this->m_func,slotId);
          pIVar14 = IR::IntConstOpnd::New(-0x3131313131313132,TyInt64,this->m_func,false);
          pSVar12 = StackSym::New(TyInt64,this->m_func);
          pSVar12->m_offset = iVar8;
          pSVar12->field_0x19 = pSVar12->field_0x19 | 0x10;
          pSVar13 = IR::SymOpnd::New(&pSVar12->super_Sym,TyInt64,this->m_func);
          pIVar15 = Func::GetFunctionEntryInsertionPoint(this->m_func);
          InsertMove(&pSVar13->super_Opnd,&pIVar14->super_Opnd,pIVar15,true);
          slotId = slotId + 1;
        } while (RVar9 - RVar10 != slotId);
      }
    }
    defaultDoLoopFastPath = local_31;
    pFVar18 = this->m_func;
    defaultDoFastPath = local_40._0_1_;
    if (pFVar18->hasAnyStackNestedFunc == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x66,"(!m_func->HasAnyStackNestedFunc())",
                         "!m_func->HasAnyStackNestedFunc()");
      if (!bVar6) {
LAB_0058ef43:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
      pFVar18 = this->m_func;
    }
  }
  LowerRange(this,pFVar18->m_headInstr,pFVar18->m_tailInstr,(bool)defaultDoFastPath,
             (bool)defaultDoLoopFastPath);
  if (((DAT_015bf41e == '\x01') && (DAT_015bf41f == '\x01')) &&
     (pIVar15 = this->m_func->m_headInstr, pIVar15 != (Instr *)0x0)) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pIVar1 = pIVar15->m_next;
      if ((pIVar15->m_src1 != (Opnd *)0x0) &&
         (OVar7 = IR::Opnd::GetKind(pIVar15->m_src1), OVar7 == OpndKindAddr)) {
        this_00 = pIVar15->m_src1;
        OVar7 = IR::Opnd::GetKind(this_00);
        if (OVar7 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar6) goto LAB_0058ef43;
          *local_40 = 0;
        }
        if (*(byte *)((long)&this_00[2].m_valueType.field_0.bits + 1) == 0x24) {
          pIVar2 = pIVar15->m_prev;
          pIVar3 = pIVar2->m_prev;
          pIVar17 = pIVar3;
          if (pIVar3->m_prev->m_opcode != LEA) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7b,"(leaInstr->m_opcode == Js::OpCode::LEA)",
                               "leaInstr->m_opcode == Js::OpCode::LEA");
            if (!bVar6) goto LAB_0058ef43;
            *local_40 = 0;
            pIVar17 = pIVar2->m_prev;
          }
          if (pIVar17->m_opcode != MOV) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7c,"(movInstr->m_opcode == Js::OpCode::MOV)",
                               "movInstr->m_opcode == Js::OpCode::MOV");
            if (!bVar6) goto LAB_0058ef43;
            *local_40 = 0;
          }
          if (pIVar15->m_prev->m_opcode != SHR) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7d,"(shrInstr->m_opcode == Js::OpCode::SHR)",
                               "shrInstr->m_opcode == Js::OpCode::SHR");
            if (!bVar6) goto LAB_0058ef43;
            *local_40 = 0;
          }
          LowererMD::LoadHelperArgument(local_48,pIVar2->m_prev,pIVar3->m_prev->m_dst);
          pIVar15 = IR::Instr::New(Call,this->m_func);
          IR::Instr::InsertBefore(pIVar2->m_prev,pIVar15);
          LowererMD::ChangeToHelperCall
                    (local_48,pIVar15,HelperWriteBarrierSetVerifyBit,(LabelInstr *)0x0,(Opnd *)0x0,
                     (PropertySymOpnd *)0x0,false);
        }
      }
      pIVar15 = pIVar1;
    } while (pIVar1 != (Instr *)0x0);
  }
  Func::ClearCloneMap(this->m_func);
  pFVar18 = this->m_func;
  if (pFVar18->hasAnyStackNestedFunc == true) {
    EnsureZeroLastStackFunctionNext(this);
    pFVar18 = this->m_func;
  }
  JITTimeWorkItem::GetJitMode(pFVar18->m_workItem);
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_alloc = (JitArenaAllocator *)0x0;
  this->m_func->canHoistConstantAddressLoad = false;
  pBVar20 = localAlloc.super_JitArenaAllocator.bvFreeList;
  if (local_68.head != (BVSparseNode *)0x0) {
    pBVar4 = local_68.head;
    pBVar20 = (local_68.alloc)->bvFreeList;
    do {
      pBVar19 = pBVar4;
      pBVar4 = pBVar19->next;
      pBVar19->next = pBVar20;
      pBVar20 = pBVar19;
    } while (pBVar4 != (Type)0x0);
    (local_68.alloc)->bvFreeList = pBVar19;
    pBVar20 = localAlloc.super_JitArenaAllocator.bvFreeList;
  }
  while (pBVar20 != (BVSparseNode *)0x0) {
    pBVar4 = pBVar20->next;
    pBVar20->next =
         (Type)localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList;
    localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = pBVar20;
    pBVar20 = pBVar4;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_110);
  return;
}

Assistant:

void
Lowerer::Lower()
{

    this->m_func->StopMaintainByteCodeOffset();

    NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-Lower"), this->m_func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->m_alloc = &localAlloc;
    BVSparse<JitArenaAllocator> localInitializedTempSym(&localAlloc);
    this->initializedTempSym = &localInitializedTempSym;
    BVSparse<JitArenaAllocator> localAddToLiveOnBackEdgeSyms(&localAlloc);
    this->addToLiveOnBackEdgeSyms = &localAddToLiveOnBackEdgeSyms;
    Assert(this->m_func->GetCloneMap() == nullptr);

    m_lowererMD.Init(this);

    bool defaultDoFastPath = this->m_func->DoFastPaths();
    bool loopFastPath = this->m_func->DoLoopFastPaths();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureStackFunctionListStackSym();
    }
    if (m_func->DoStackFrameDisplay() && !m_func->IsLoopBody())
    {
        AllocStackClosure();
    }

    AllocStackForInObjectEnumeratorArray();

    if (m_func->IsJitInDebugMode())
    {
        // Initialize metadata of local var slots.
        // Too late to wait until Register Allocator, as we need the offset when lowerering bailout for debugger.
        int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
        if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
        {
            // MOV [EBP + m_func->GetHasLocalVarChangedOffset()], 0
            StackSym* sym = StackSym::New(TyInt8, m_func);
            sym->m_offset = hasLocalVarChangedOffset;
            sym->m_allocated = true;
            IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
            Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());

#ifdef DBG
            // Pre-fill all local slots with a pattern. This will help identify non-initialized/garbage var values.
            // Note that in the beginning of the function in bytecode we should initialize all locals to undefined.
            uint32 localSlotCount = m_func->GetJITFunctionBody()->GetEndNonTempLocalIndex() - m_func->GetJITFunctionBody()->GetFirstNonTempLocalIndex();
            for (uint i = 0; i < localSlotCount; ++i)
            {
                int offset = m_func->GetLocalVarSlotOffset(i);

                IRType opnd1Type;

#if defined(TARGET_32)
                opnd1Type = TyInt32;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern4, opnd1Type, m_func);
#else
                opnd1Type = TyInt64;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern8, opnd1Type, m_func);
#endif

                sym = StackSym::New(opnd1Type, m_func);
                sym->m_offset = offset;
                sym->m_allocated = true;
                opnd1 = IR::SymOpnd::New(sym, opnd1Type, m_func);
                Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());
            }
#endif
        }

        Assert(!m_func->HasAnyStackNestedFunc());
    }

    this->LowerRange(m_func->m_headInstr, m_func->m_tailInstr, defaultDoFastPath, loopFastPath);

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    // TODO: (leish)(swb) implement for arm
#if defined(_M_IX86) || defined(_M_AMD64)
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        // find out all write barrier setting instr, call Recycler::WBSetBit for verification purpose
        // should do this in LowererMD::GenerateWriteBarrier, however, can't insert call instruction there
        FOREACH_INSTR_EDITING(instr, instrNext, m_func->m_headInstr)
            if (instr->m_src1 && instr->m_src1->IsAddrOpnd())
            {
                IR::AddrOpnd* addrOpnd = instr->m_src1->AsAddrOpnd();
                if (addrOpnd->GetAddrOpndKind() == IR::AddrOpndKindWriteBarrierCardTable)
                {
                    auto& leaInstr = instr->m_prev->m_prev->m_prev;
                    auto& movInstr = instr->m_prev->m_prev;
                    auto& shrInstr = instr->m_prev;
                    Assert(leaInstr->m_opcode == Js::OpCode::LEA);
                    Assert(movInstr->m_opcode == Js::OpCode::MOV);
                    Assert(shrInstr->m_opcode == Js::OpCode::SHR);
                    m_lowererMD.LoadHelperArgument(movInstr, leaInstr->m_dst);
                    IR::Instr* instrCall = IR::Instr::New(Js::OpCode::Call, m_func);
                    movInstr->InsertBefore(instrCall);
                    m_lowererMD.ChangeToHelperCall(instrCall, IR::HelperWriteBarrierSetVerifyBit);
                }
            }
        NEXT_INSTR_EDITING
    }
#endif
#endif

    this->m_func->ClearCloneMap();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureZeroLastStackFunctionNext();
    }

    if (!m_func->IsSimpleJit())
    {
#if 0 // TODO michhol oop jit, reenable assert
        Js::EntryPointInfo* entryPointInfo = this->m_func->m_workItem->GetEntryPoint();
        Assert(entryPointInfo->GetJitTransferData() != nullptr && !entryPointInfo->GetJitTransferData()->GetIsReady());
#endif
    }

    this->initializedTempSym = nullptr;
    this->m_alloc = nullptr;

    this->m_func->DisableConstandAddressLoadHoist();
}